

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::TraverseSchema::processElemDeclIC
          (TraverseSchema *this,DOMElement *icElem,SchemaElementDecl *elemDecl)

{
  short sVar1;
  short sVar2;
  MemoryManager *pMVar3;
  XMLSize_t XVar4;
  XMLCh *key1;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ValueVectorOf<xercesc_4_0::DOMElement_*> *this_00;
  undefined4 extraout_var_01;
  RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
  *pRVar8;
  undefined4 extraout_var_02;
  RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::DOMElement_*>,_xercesc_4_0::PtrHasher>
  *pRVar9;
  undefined4 extraout_var_03;
  ulong uVar10;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *pVVar11;
  undefined4 extraout_var_04;
  short *psVar12;
  XMLSize_t XVar13;
  RefHashTableBucketElem<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>_> *pRVar14;
  XMLCh *pXVar15;
  XMLCh XVar16;
  short *psVar7;
  
  if (icElem != (DOMElement *)0x0) {
    this_00 = (ValueVectorOf<xercesc_4_0::DOMElement_*> *)0x0;
    do {
      iVar6 = (*(icElem->super_DOMNode)._vptr_DOMNode[0x18])(icElem);
      psVar7 = (short *)CONCAT44(extraout_var,iVar6);
      if (psVar7 == &SchemaSymbols::fgELT_KEY) {
LAB_0032ed99:
        traverseKey(this,icElem,elemDecl);
      }
      else {
        psVar12 = &SchemaSymbols::fgELT_KEY;
        if (psVar7 == (short *)0x0) {
LAB_0032ed51:
          if (*psVar12 == 0) goto LAB_0032ed99;
        }
        else {
          psVar12 = &SchemaSymbols::fgELT_KEY;
          do {
            sVar1 = *psVar7;
            if (sVar1 == 0) goto LAB_0032ed51;
            psVar7 = psVar7 + 1;
            sVar2 = *psVar12;
            psVar12 = psVar12 + 1;
          } while (sVar1 == sVar2);
        }
        iVar6 = (*(icElem->super_DOMNode)._vptr_DOMNode[0x18])(icElem);
        psVar7 = (short *)CONCAT44(extraout_var_00,iVar6);
        if (psVar7 == &SchemaSymbols::fgELT_UNIQUE) {
LAB_0032ee50:
          traverseUnique(this,icElem,elemDecl);
        }
        else {
          psVar12 = &SchemaSymbols::fgELT_UNIQUE;
          if (psVar7 == (short *)0x0) {
LAB_0032edac:
            if (*psVar12 == 0) goto LAB_0032ee50;
          }
          else {
            psVar12 = &SchemaSymbols::fgELT_UNIQUE;
            do {
              sVar1 = *psVar7;
              if (sVar1 == 0) goto LAB_0032edac;
              psVar7 = psVar7 + 1;
              sVar2 = *psVar12;
              psVar12 = psVar12 + 1;
            } while (sVar1 == sVar2);
          }
          if (this_00 == (ValueVectorOf<xercesc_4_0::DOMElement_*> *)0x0) {
            this_00 = (ValueVectorOf<xercesc_4_0::DOMElement_*> *)
                      XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
            pMVar3 = this->fGrammarPoolMemoryManager;
            this_00->fCallDestructor = false;
            this_00->fCurCount = 0;
            this_00->fMaxCount = 8;
            this_00->fElemList = (DOMElement **)0x0;
            this_00->fMemoryManager = pMVar3;
            iVar6 = (*pMVar3->_vptr_MemoryManager[3])();
            this_00->fElemList = (DOMElement **)CONCAT44(extraout_var_01,iVar6);
            memset((DOMElement **)CONCAT44(extraout_var_01,iVar6),0,this_00->fMaxCount << 3);
          }
          ValueVectorOf<xercesc_4_0::DOMElement_*>::ensureExtraCapacity(this_00,1);
          XVar4 = this_00->fCurCount;
          this_00->fCurCount = XVar4 + 1;
          this_00->fElemList[XVar4] = icElem;
        }
      }
      icElem = XUtil::getNextSiblingElementNS
                         (&icElem->super_DOMNode,(XMLCh **)fgIdentityConstraints,
                          L"http://www.w3.org/2001/XMLSchema",3);
    } while (&icElem->super_DOMNode != (DOMNode *)0x0);
    if (this_00 != (ValueVectorOf<xercesc_4_0::DOMElement_*> *)0x0) {
      pRVar8 = this->fIC_ElementsNS;
      if (pRVar8 == (RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                     *)0x0) {
        pRVar8 = (RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                  *)XMemory::operator_new(0x38,this->fMemoryManager);
        pMVar3 = this->fMemoryManager;
        pRVar8->fMemoryManager = pMVar3;
        pRVar8->fAdoptedElems = true;
        pRVar8->fBucketList =
             (RefHashTableBucketElem<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>_>
              **)0x0;
        pRVar8->fHashModulus = 0xd;
        pRVar8->fInitialModulus = 0xd;
        pRVar8->fCount = 0;
        iVar6 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,0x68);
        pRVar8->fBucketList =
             (RefHashTableBucketElem<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>_>
              **)CONCAT44(extraout_var_02,iVar6);
        XVar4 = pRVar8->fHashModulus;
        if (XVar4 != 0) {
          XVar13 = 0;
          do {
            pRVar8->fBucketList[XVar13] =
                 (RefHashTableBucketElem<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>_>
                  *)0x0;
            XVar13 = XVar13 + 1;
          } while (XVar4 != XVar13);
        }
        this->fIC_ElementsNS = pRVar8;
        pRVar9 = (RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::DOMElement_*>,_xercesc_4_0::PtrHasher>
                  *)XMemory::operator_new(0x38,this->fMemoryManager);
        pMVar3 = this->fMemoryManager;
        pRVar9->fMemoryManager = pMVar3;
        pRVar9->fAdoptedElems = true;
        pRVar9->fBucketList =
             (RefHashTableBucketElem<xercesc_4_0::ValueVectorOf<xercesc_4_0::DOMElement_*>_> **)0x0;
        pRVar9->fHashModulus = 0x1d;
        pRVar9->fInitialModulus = 0x1d;
        pRVar9->fCount = 0;
        iVar6 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,0xe8);
        pRVar9->fBucketList =
             (RefHashTableBucketElem<xercesc_4_0::ValueVectorOf<xercesc_4_0::DOMElement_*>_> **)
             CONCAT44(extraout_var_03,iVar6);
        XVar4 = pRVar9->fHashModulus;
        if (XVar4 != 0) {
          XVar13 = 0;
          do {
            pRVar9->fBucketList[XVar13] =
                 (RefHashTableBucketElem<xercesc_4_0::ValueVectorOf<xercesc_4_0::DOMElement_*>_> *)
                 0x0;
            XVar13 = XVar13 + 1;
          } while (XVar4 != XVar13);
        }
        this->fIC_NodeListNS = pRVar9;
        pRVar8 = this->fIC_ElementsNS;
      }
      key1 = this->fTargetNSURIString;
      if ((key1 == (XMLCh *)0x0) || (uVar10 = (ulong)(ushort)*key1, uVar10 == 0)) {
        uVar10 = 0;
      }
      else {
        XVar16 = key1[1];
        if (XVar16 != L'\0') {
          pXVar15 = key1 + 2;
          do {
            uVar10 = (ulong)(ushort)XVar16 + (uVar10 >> 0x18) + uVar10 * 0x26;
            XVar16 = *pXVar15;
            pXVar15 = pXVar15 + 1;
          } while (XVar16 != L'\0');
        }
        uVar10 = uVar10 % pRVar8->fHashModulus;
      }
      pRVar14 = pRVar8->fBucketList[uVar10];
      if (pRVar14 !=
          (RefHashTableBucketElem<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>_> *)
          0x0) {
        do {
          bVar5 = StringHasher::equals((StringHasher *)&pRVar8->field_0x30,key1,pRVar14->fKey);
          if (bVar5) {
            pVVar11 = pRVar14->fData;
            this->fIC_Elements = pVVar11;
            if (pVVar11 == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0)
            goto LAB_0032f02b;
            goto LAB_0032f0a3;
          }
          pRVar14 = pRVar14->fNext;
        } while (pRVar14 !=
                 (RefHashTableBucketElem<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>_>
                  *)0x0);
      }
      this->fIC_Elements = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0;
LAB_0032f02b:
      pVVar11 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)
                XMemory::operator_new(0x28,this->fMemoryManager);
      pMVar3 = this->fMemoryManager;
      pVVar11->fCallDestructor = false;
      pVVar11->fCurCount = 0;
      pVVar11->fMaxCount = 8;
      pVVar11->fElemList = (SchemaElementDecl **)0x0;
      pVVar11->fMemoryManager = pMVar3;
      iVar6 = (*pMVar3->_vptr_MemoryManager[3])();
      pVVar11->fElemList = (SchemaElementDecl **)CONCAT44(extraout_var_04,iVar6);
      memset((SchemaElementDecl **)CONCAT44(extraout_var_04,iVar6),0,pVVar11->fMaxCount << 3);
      this->fIC_Elements = pVVar11;
      RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
      ::put(this->fIC_ElementsNS,this->fTargetNSURIString,pVVar11);
LAB_0032f0a3:
      RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::DOMElement_*>,_xercesc_4_0::PtrHasher>
      ::put(this->fIC_NodeListNS,elemDecl,this_00);
      pVVar11 = this->fIC_Elements;
      ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ensureExtraCapacity(pVVar11,1);
      XVar4 = pVVar11->fCurCount;
      pVVar11->fCurCount = XVar4 + 1;
      pVVar11->fElemList[XVar4] = elemDecl;
    }
  }
  return;
}

Assistant:

void TraverseSchema::processElemDeclIC(DOMElement* const icElem,
                                       SchemaElementDecl* const elemDecl)
{
    // key/keyref/unique processing
    ValueVectorOf<DOMElement*>* icNodes = 0;
    DOMElement* ic = icElem;
    while (ic != 0) {

        if (XMLString::equals(ic->getLocalName(), SchemaSymbols::fgELT_KEY)) {
            traverseKey(ic, elemDecl);
        }
        else if (XMLString::equals(ic->getLocalName(), SchemaSymbols::fgELT_UNIQUE)) {
            traverseUnique(ic, elemDecl);
        }
        else {

            if (!icNodes) {
                icNodes = new (fGrammarPoolMemoryManager) ValueVectorOf<DOMElement*>(8, fGrammarPoolMemoryManager);
            }

            icNodes->addElement(ic);
        }

        ic = XUtil::getNextSiblingElementNS(
            ic, fgIdentityConstraints, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, 3);
    }

    if (icNodes) {

        if (!fIC_ElementsNS) {

            fIC_ElementsNS = new (fMemoryManager) RefHashTableOf<ElemVector>(13, fMemoryManager);
            fIC_NodeListNS = new (fMemoryManager) RefHashTableOf<ValueVectorOf<DOMElement*>, PtrHasher>(29, true, fMemoryManager);
        }

        fIC_Elements = fIC_ElementsNS->get(fTargetNSURIString);
        if (!fIC_Elements) {
            fIC_Elements = new (fMemoryManager) ValueVectorOf<SchemaElementDecl*>(8, fMemoryManager);
            fIC_ElementsNS->put((void*) fTargetNSURIString, fIC_Elements);
        }

        fIC_NodeListNS->put(elemDecl, icNodes);
        fIC_Elements->addElement(elemDecl);
    }
}